

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Nullability __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Nullability nullability)

{
  Nullability NVar1;
  
  if (nullability == Nullable) {
    return Nullable;
  }
  NVar1 = getNullability(this);
  return NVar1;
}

Assistant:

Nullability TranslateToFuzzReader::getSuperType(Nullability nullability) {
  if (nullability == Nullable) {
    return Nullable;
  }
  return getNullability();
}